

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

uint128_wrapper *
fmt::v7::detail::dragonbox::cache_accessor<double>::get_cached_power
          (uint128_wrapper *__return_storage_ptr__,int k)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint128_wrapper *puVar8;
  int iVar9;
  uint uVar10;
  
  iVar9 = (int)__return_storage_ptr__;
  uVar10 = iVar9 + 0x124;
  if (0x26a < uVar10) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                ,0x75e,"k is out of range");
  }
  iVar7 = (uVar10 / 0x1b) * 0x1b + -0x124;
  uVar6 = (ulong)((uint)((ulong)uVar10 * 0x12f684bdb >> 0x21) & 0xfffffff0);
  puVar8 = *(uint128_wrapper **)(basic_data<void>::dragonbox_pow10_significands_128 + uVar6);
  iVar4 = iVar9 - iVar7;
  if (iVar4 != 0) {
    if (0x9a2 < iVar9 + 0x4d1U) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                  ,0x6c3,"too large exponent");
    }
    iVar9 = (iVar9 * 0x1a934f >> 0x13) - ((iVar7 * 0x1a934f >> 0x13) + iVar4);
    if (0x3e < iVar9 - 1U) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                  ,0x772,"shifting error detected");
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)(basic_data<void>::powers_of_5_64 + (long)iVar4 * 8);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)puVar8 - (ulong)(uVar10 < 0x129);
    bVar3 = (byte)iVar9 & 0x3f;
    uVar5 = SUB168(auVar1 * auVar2,0) >> bVar3 |
            SUB168(auVar1 * auVar2,8) +
            *(long *)(basic_data<void>::dragonbox_pow10_significands_128 + uVar6 + 8) *
            *(ulong *)(basic_data<void>::powers_of_5_64 + (long)iVar4 * 8) << 0x40 - bVar3;
    uVar6 = uVar5 + 1;
    if (0x128 < uVar10) {
      uVar6 = uVar5;
    }
    uVar5 = (ulong)(*(uint *)(basic_data<void>::dragonbox_pow10_recovery_errors +
                             (ulong)(uVar10 >> 4) * 4) >> ((char)uVar10 * '\x02' & 0x1fU) & 3);
    puVar8 = (uint128_wrapper *)(uVar5 + uVar6);
    if (CARRY8(uVar5,uVar6)) {
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                  ,0x78c,"");
    }
  }
  return puVar8;
}

Assistant:

static uint128_wrapper get_cached_power(int k) FMT_NOEXCEPT {
    FMT_ASSERT(k >= float_info<double>::min_k && k <= float_info<double>::max_k,
               "k is out of range");

#if FMT_USE_FULL_CACHE_DRAGONBOX
    return data::dragonbox_pow10_significands_128[k -
                                                  float_info<double>::min_k];
#else
    static const int compression_ratio = 27;

    // Compute base index.
    int cache_index = (k - float_info<double>::min_k) / compression_ratio;
    int kb = cache_index * compression_ratio + float_info<double>::min_k;
    int offset = k - kb;

    // Get base cache.
    uint128_wrapper base_cache =
        data::dragonbox_pow10_significands_128[cache_index];
    if (offset == 0) return base_cache;

    // Compute the required amount of bit-shift.
    int alpha = floor_log2_pow10(kb + offset) - floor_log2_pow10(kb) - offset;
    FMT_ASSERT(alpha > 0 && alpha < 64, "shifting error detected");

    // Try to recover the real cache.
    uint64_t pow5 = data::powers_of_5_64[offset];
    uint128_wrapper recovered_cache = umul128(base_cache.high(), pow5);
    uint128_wrapper middle_low =
        umul128(base_cache.low() - (kb < 0 ? 1u : 0u), pow5);

    recovered_cache += middle_low.high();

    uint64_t high_to_middle = recovered_cache.high() << (64 - alpha);
    uint64_t middle_to_low = recovered_cache.low() << (64 - alpha);

    recovered_cache =
        uint128_wrapper{(recovered_cache.low() >> alpha) | high_to_middle,
                        ((middle_low.low() >> alpha) | middle_to_low)};

    if (kb < 0) recovered_cache += 1;

    // Get error.
    int error_idx = (k - float_info<double>::min_k) / 16;
    uint32_t error = (data::dragonbox_pow10_recovery_errors[error_idx] >>
                      ((k - float_info<double>::min_k) % 16) * 2) &
                     0x3;

    // Add the error back.
    FMT_ASSERT(recovered_cache.low() + error >= recovered_cache.low(), "");
    return {recovered_cache.high(), recovered_cache.low() + error};
#endif
  }